

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O1

RC __thiscall RM_FileHandle::AllocateNewPage(RM_FileHandle *this,PF_PageHandle *ph,PageNum *page)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  RC RVar4;
  uint uVar5;
  uint uVar6;
  char *pData;
  PageNum *local_20;
  
  RVar4 = PF_FileHandle::AllocatePage(&this->pfh,ph);
  if (RVar4 == 0) {
    RVar4 = PF_PageHandle::GetPageNum(ph,page);
    if (RVar4 == 0) {
      RVar4 = PF_PageHandle::GetData(ph,(char **)&local_20);
      if (RVar4 == 0) {
        iVar2 = (this->header).bitmapOffset;
        *local_20 = (this->header).firstFreePage;
        local_20[1] = 0;
        uVar3 = (this->header).numRecordsPerPage;
        uVar6 = uVar3 + 7;
        if (-1 < (int)uVar3) {
          uVar6 = uVar3;
        }
        uVar3 = (uint)((int)(uVar6 & 0xfffffff8) < (int)uVar3);
        uVar5 = uVar3 + ((int)uVar6 >> 3);
        if (uVar5 != 0 && SCARRY4(uVar3,(int)uVar6 >> 3) == (int)uVar5 < 0) {
          memset((void *)((long)local_20 + (long)iVar2),0,(ulong)uVar5);
        }
        piVar1 = &(this->header).numPages;
        *piVar1 = *piVar1 + 1;
        (this->header).firstFreePage = *page;
        RVar4 = 0;
      }
    }
  }
  return RVar4;
}

Assistant:

RC RM_FileHandle::AllocateNewPage(PF_PageHandle &ph, PageNum &page){
  RC rc;
  // allocate the page
  if((rc = pfh.AllocatePage(ph))){
    return (rc);
  }
  // get the page number of this allocated page
  if((rc = ph.GetPageNum(page)))
    return (rc);
 
  // create the page header
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    return (rc);
  pageheader->nextFreePage = header.firstFreePage;
  pageheader->numRecords = 0;
  if((rc = ResetBitmap(bitmap, header.numRecordsPerPage)))
    return (rc);

  header.numPages++; // update the file header to reflect addition of one
                     // more page
  // update the free pages linked list
  header.firstFreePage = page;
  return (0);
}